

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_proxy_isArray(JSContext *ctx,JSValue obj)

{
  JSValue *pJVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((((int)obj.tag == -1) && (*(short *)((long)obj.u.ptr + 6) == 0x29)) &&
     (pJVar1 = *(JSValue **)((long)obj.u.ptr + 0x30), pJVar1 != (JSValue *)0x0)) {
    if (*(char *)((long)&pJVar1[2].u + 1) == '\0') {
      iVar2 = JS_IsArray(ctx,*pJVar1);
      return iVar2;
    }
    JS_ThrowTypeError(ctx,"revoked proxy");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int js_proxy_isArray(JSContext *ctx, JSValueConst obj)
{
    JSProxyData *s = JS_GetOpaque(obj, JS_CLASS_PROXY);
    if (!s)
        return FALSE;
    if (s->is_revoked) {
        JS_ThrowTypeErrorRevokedProxy(ctx);
        return -1;
    }
    return JS_IsArray(ctx, s->target);
}